

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

void __thiscall
Js::TypedArrayBase::ExtractSnapObjectDataInto
          (TypedArrayBase *this,SnapObject *objData,SlabAllocator *alloc)

{
  SnapTypedArrayInfo *addtlInfo;
  TTD_PTR_ID *dependsOnArray;
  
  addtlInfo = (SnapTypedArrayInfo *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  addtlInfo->ArrayBufferAddr = (TTD_PTR_ID)(this->super_ArrayBufferParent).arrayBuffer.ptr;
  addtlInfo->ByteOffset = this->byteOffset;
  addtlInfo->Length = (this->super_ArrayBufferParent).super_ArrayObject.length;
  dependsOnArray = (TTD_PTR_ID *)TTD::SlabAllocatorBase<0>::SlabAllocateRawSize<true,true>(alloc,8);
  *dependsOnArray = (TTD_PTR_ID)(this->super_ArrayBufferParent).arrayBuffer.ptr;
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapTypedArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)24>
            (objData,addtlInfo,alloc,1,dependsOnArray);
  return;
}

Assistant:

void TypedArrayBase::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapTypedArrayInfo* stai = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapTypedArrayInfo>();
        stai->ArrayBufferAddr = TTD_CONVERT_VAR_TO_PTR_ID(this->GetArrayBuffer());
        stai->ByteOffset = this->GetByteOffset();
        stai->Length = this->GetLength();

        TTD_PTR_ID* depArray = alloc.SlabAllocateArray<TTD_PTR_ID>(1);
        depArray[0] = TTD_CONVERT_VAR_TO_PTR_ID(this->GetArrayBuffer());

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapTypedArrayInfo*, TTD::NSSnapObjects::SnapObjectType::SnapTypedArrayObject>(objData, stai, alloc, 1, depArray);
    }